

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O0

void amrex::BroadcastStringArray
               (Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *bSA,int myLocalId,int rootId,MPI_Comm *localComm)

{
  int in_EDX;
  int in_ESI;
  Vector<char,_std::allocator<char>_> serialStringArray;
  Vector<char,_std::allocator<char>_> *in_stack_00000188;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000198;
  Vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  Vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  Vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  
  Vector<char,_std::allocator<char>_>::Vector((Vector<char,_std::allocator<char>_> *)0xf4bc80);
  if (in_ESI == in_EDX) {
    SerializeStringArray(in_stack_00000198);
    Vector<char,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    Vector<char,_std::allocator<char>_>::~Vector((Vector<char,_std::allocator<char>_> *)0xf4bcb4);
  }
  BroadcastArray<char>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
             (MPI_Comm *)in_stack_ffffffffffffff90);
  if (in_ESI != in_EDX) {
    UnSerializeStringArray_abi_cxx11_(in_stack_00000188);
    Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffff90,
                (Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffff88);
    Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0xf4bd1d);
  }
  Vector<char,_std::allocator<char>_>::~Vector((Vector<char,_std::allocator<char>_> *)0xf4bd27);
  return;
}

Assistant:

void amrex::BroadcastStringArray(Vector<std::string> &bSA, int myLocalId, int rootId, const MPI_Comm &localComm)
{
  Vector<char> serialStringArray;
  if(myLocalId == rootId) {
    serialStringArray = amrex::SerializeStringArray(bSA);
  }

  amrex::BroadcastArray(serialStringArray, myLocalId, rootId, localComm);

  if(myLocalId != rootId) {
    bSA = amrex::UnSerializeStringArray(serialStringArray);
  }
}